

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_hdwallet.cpp
# Opt level: O2

string * __thiscall
cfd::api::HDWalletApi::GetPubkeyFromExtkey
          (string *__return_storage_ptr__,HDWalletApi *this,string *extkey,NetType net_type)

{
  char cVar1;
  CfdException *this_00;
  uint32_t uVar2;
  allocator local_1c1;
  uint32_t version;
  string errmsg;
  string result;
  ExtPubkey ext_pubkey;
  ExtPrivkey ext_privkey;
  
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  cfd::core::ExtPrivkey::ExtPrivkey(&ext_privkey);
  cfd::core::ExtPubkey::ExtPubkey(&ext_pubkey);
  cfd::core::ExtPrivkey::ExtPrivkey((ExtPrivkey *)&errmsg,(string *)extkey);
  core::ExtPrivkey::operator=(&ext_privkey,(ExtPrivkey *)&errmsg);
  core::ExtPrivkey::~ExtPrivkey((ExtPrivkey *)&errmsg);
  cVar1 = cfd::core::ExtPrivkey::IsValid();
  if (cVar1 == '\0') {
    cfd::core::ExtPubkey::ExtPubkey((ExtPubkey *)&errmsg,(string *)extkey);
  }
  else {
    cfd::core::ExtPrivkey::GetExtPubkey();
  }
  core::ExtPubkey::operator=(&ext_pubkey,(ExtPubkey *)&errmsg);
  core::ExtPubkey::~ExtPubkey((ExtPubkey *)&errmsg);
  version = cfd::core::ExtPubkey::GetVersion();
  uVar2 = 0x43587cf;
  if (net_type == kLiquidV1) {
    uVar2 = 0x488b21e;
  }
  if (net_type == kMainnet) {
    uVar2 = 0x488b21e;
  }
  if (version == uVar2) {
    cfd::core::ExtPubkey::GetPubkey();
    cfd::core::Pubkey::GetHex_abi_cxx11_();
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&errmsg);
    core::ExtPubkey::~ExtPubkey(&ext_pubkey);
    core::ExtPrivkey::~ExtPrivkey(&ext_privkey);
    std::__cxx11::string::~string((string *)&result);
    return __return_storage_ptr__;
  }
  errmsg._M_dataplus._M_p = "cfdapi_hdwallet.cpp";
  errmsg._M_string_length._0_4_ = 0x166;
  errmsg.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_12f5bb;
  core::logger::warn<unsigned_int&>
            ((CfdSourceLocation *)&errmsg,"Version unmatch. key version: {}",&version);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&errmsg,"extkey networkType unmatch.",&local_1c1);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,&errmsg);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

std::string HDWalletApi::GetPubkeyFromExtkey(
    const std::string& extkey, NetType net_type) const {
  std::string result;
  ExtPrivkey ext_privkey;
  ExtPubkey ext_pubkey;

  try {
    ext_privkey = ExtPrivkey(extkey);
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if ((errmsg.find(kBase58Error) == std::string::npos) &&
        (errmsg.find(kKeyTypeError) == std::string::npos)) {
      throw except;
    }
  }

  if (ext_privkey.IsValid()) {
    ext_pubkey = ext_privkey.GetExtPubkey();
  } else {
    try {
      ext_pubkey = ExtPubkey(extkey);
    } catch (const CfdException& pub_except) {
      std::string errmsg(pub_except.what());
      if (errmsg.find(kBase58Error) != std::string::npos) {
        warn(CFD_LOG_SOURCE, "Illegal extkey. base58 decode error.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Illegal extkey. base58 decode error.");
      }
      throw pub_except;
    }
  }

  uint32_t version = ext_pubkey.GetVersion();
  uint32_t check_version = GetExtkeyVersion(ExtKeyType::kExtPubkey, net_type);
  if (version != check_version) {
    warn(CFD_LOG_SOURCE, "Version unmatch. key version: {}", version);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "extkey networkType unmatch.");
  }
  return ext_pubkey.GetPubkey().GetHex();
}